

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::PushTarget(SQFuncState *this,SQInteger n)

{
  long in_RSI;
  sqvector<long_long> *in_RDI;
  SQFuncState *in_stack_00000030;
  longlong *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  if (in_RSI == -1) {
    local_8 = AllocStackPos(in_stack_00000030);
    sqvector<long_long>::push_back(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    sqvector<long_long>::push_back(in_RDI,in_stack_ffffffffffffffd8);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

SQInteger SQFuncState::PushTarget(SQInteger n)
{
    if(n!=-1){
        _targetstack.push_back(n);
        return n;
    }
    n=AllocStackPos();
    _targetstack.push_back(n);
    return n;
}